

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void freeDeepBuffers<Imath_3_2::half>
               (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                *channels)

{
  bool bVar1;
  reference this;
  long lVar2;
  half **pphVar3;
  int x;
  int y;
  Array2D<Imath_3_2::half_*> *channel;
  iterator i;
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
  *in_stack_ffffffffffffffb8;
  int local_28;
  int local_24;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    this = std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_>::operator*
                     ((_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_> *)0x11a979);
    local_24 = 0;
    while( true ) {
      lVar2 = Imf_3_4::Array2D<Imath_3_2::half_*>::height(this);
      if (lVar2 <= local_24) break;
      local_28 = 0;
      while( true ) {
        lVar2 = Imf_3_4::Array2D<Imath_3_2::half_*>::width(this);
        if (lVar2 <= local_28) break;
        pphVar3 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](this,(long)local_24);
        in_stack_ffffffffffffffb8 =
             (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
              *)pphVar3[local_28];
        if (in_stack_ffffffffffffffb8 !=
            (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
             *)0x0) {
          operator_delete__(in_stack_ffffffffffffffb8);
        }
        local_28 = local_28 + 1;
      }
      local_24 = local_24 + 1;
    }
    std::_List_iterator<Imf_3_4::Array2D<Imath_3_2::half_*>_>::operator++(local_10,0);
  }
  return;
}

Assistant:

void
freeDeepBuffers (list<Array2D<T*>>& channels)
{
    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
            for (int x = 0; x < channel.width (); x++)
                delete[] channel[y][x];
    }
}